

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

ssize_t __thiscall
wasm::LEB<long,_signed_char>::write(LEB<long,_signed_char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  byte local_22;
  byte local_21;
  uint8_t byte;
  long lStack_20;
  bool more;
  long temp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  LEB<long,_signed_char> *this_local;
  
  temp = CONCAT44(in_register_00000034,__fd);
  lStack_20 = this->value;
  out_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  do {
    local_22 = (byte)lStack_20 & 0x7f;
    lStack_20 = lStack_20 >> 7;
    local_21 = hasMore(this,lStack_20,local_22);
    if ((bool)local_21) {
      local_22 = local_22 | 0x80;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)temp,&local_22);
  } while ((local_21 & 1) != 0);
  return extraout_RAX;
}

Assistant:

void write(std::vector<uint8_t>* out) {
    T temp = value;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte);
      if (more) {
        byte = byte | 128;
      }
      out->push_back(byte);
    } while (more);
  }